

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni.h
# Opt level: O1

int CVmCaseFoldStr::wstreq(wchar_t *a,wchar_t *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int unaff_EBP;
  CVmCaseFoldStr fb;
  CVmCaseFoldStr fa;
  CVmCaseFoldStr local_80;
  CVmCaseFoldStr local_58;
  
  local_58.rem = wcslen(a);
  local_58.fpbase = local_58.ie;
  local_58.fp = local_58.ie + 1;
  local_58.ie[1] = L'\0';
  local_58.p = a;
  local_80.rem = wcslen(b);
  local_80.fpbase = local_80.ie;
  local_80.fp = local_80.ie + 1;
  local_80.ie[1] = L'\0';
  local_80.p = b;
  do {
    wVar1 = getch(&local_58);
    wVar2 = getch(&local_80);
    if (wVar1 == L'\0') {
      unaff_EBP = 1;
    }
    if (wVar1 != wVar2) {
      unaff_EBP = 0;
    }
  } while ((wVar1 != L'\0') && (wVar1 == wVar2));
  return unaff_EBP;
}

Assistant:

static int wstreq(const wchar_t *a, const wchar_t *b)
    {
        /* loop over characters until we find a mismatch */
        for (CVmCaseFoldStr fa(a), fb(b) ; ; )
        {
            /* get the next character of each folded string */
            wchar_t ca = fa.getch();
            wchar_t cb = fb.getch();
            
            /* if they differ, return not equal */
            if (ca != cb)
                return FALSE;
            
            /* if they both ended here, we have a match */
            if (ca == 0)
                return TRUE;
        }
    }